

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_get_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  char *__haystack;
  byte bVar1;
  SessionHandle *data;
  void *pvVar2;
  CURLcode CVar3;
  char *pcVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  _Bool connected;
  _Bool local_39;
  connectdata *local_38;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
    if ((instate == FTP_LIST) ||
       (((data->set).prefer_ascii != false || (0 < *(long *)((long)pvVar2 + 0x20))))) {
      lVar8 = -1;
      if (-1 < *(long *)((long)pvVar2 + 0x20)) {
        lVar8 = *(long *)((long)pvVar2 + 0x20);
      }
    }
    else {
      __haystack = (data->state).buffer;
      pcVar4 = strstr(__haystack," bytes");
      lVar8 = -1;
      if (pcVar4 != (char *)0x0) {
        pbVar6 = (byte *)(pcVar4 + -1);
        local_38 = conn;
        if (pbVar6 + ~(ulong)__haystack != (byte *)0x0) {
          lVar7 = (long)data + (0x892 - (long)pcVar4);
          do {
            bVar1 = *pbVar6;
            if ((ulong)bVar1 == 0x28) break;
            ppuVar5 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
              pbVar6 = (byte *)0x0;
              break;
            }
            pbVar6 = pbVar6 + -1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0);
        }
        conn = local_38;
        if (pbVar6 != (byte *)0x0) {
          lVar8 = strtol((char *)(pbVar6 + 1),(char **)0x0,0);
        }
      }
    }
    lVar7 = (data->req).maxdownload;
    if (lVar7 < 1 || lVar8 <= lVar7) {
      if ((instate != FTP_LIST) && ((data->set).prefer_ascii != false)) {
        lVar8 = -1;
      }
    }
    else {
      (data->req).size = lVar7;
      lVar8 = lVar7;
    }
    Curl_infof(data,"Maxdownload = %ld\n");
    if (instate != FTP_LIST) {
      Curl_infof(data,"Getting file with size: %ld\n",lVar8);
    }
    (conn->proto).ftpc.state_saved = instate;
    (conn->proto).ftpc.retr_size_saved = lVar8;
    if ((data->set).ftp_use_port != true) {
      CVar3 = InitiateTransfer(conn);
      return CVar3;
    }
    CVar3 = AllowServerConnect(conn,&local_39);
    if ((CVar3 == CURLE_OK) && (local_39 == false)) {
      Curl_infof(data,"Data conn was not available immediately\n");
      (conn->proto).ftpc.state = FTP_STOP;
      (conn->proto).ftpc.wait_data_conn = true;
    }
  }
  else if (ftpcode == 0x1c2 && instate == FTP_LIST) {
    *(undefined4 *)((long)pvVar2 + 0x18) = 2;
    (conn->proto).ftpc.state = FTP_STOP;
    CVar3 = CURLE_OK;
  }
  else {
    Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
    CVar3 = CURLE_FTP_COULDNT_RETR_FILE;
    if (ftpcode == 0x226 && instate == FTP_RETR) {
      CVar3 = CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_get_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct FTP *ftp = data->req.protop;
  char *buf = data->state.buffer;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size=-1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->set.prefer_ascii &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either don't show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      bytes=strstr(buf, " bytes");
      if(bytes--) {
        long in=(long)(bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes=NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes++) {
          /* get the number! */
          size = curlx_strtoofft(bytes, NULL, 0);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->set.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" CURL_FORMAT_CURL_OFF_T "\n",
          data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" CURL_FORMAT_CURL_OFF_T "\n",
            size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(conn, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately\n");
        state(conn, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(conn);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = FTPTRANSFER_NONE; /* don't download anything */
      state(conn, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550?
        CURLE_REMOTE_FILE_NOT_FOUND:
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}